

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_urldecode(char *string,char *escaped,int len)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  byte *pbVar5;
  
  iVar3 = 0;
  bVar4 = 0;
LAB_0010ecae:
  do {
    pbVar5 = (byte *)escaped;
    if (len == 0) {
LAB_0010ed14:
      *string = 0;
      return 0;
    }
    while( true ) {
      escaped = (char *)(pbVar5 + 1);
      bVar2 = *pbVar5;
      if (bVar2 == 0) goto LAB_0010ed14;
      if (iVar3 != 0) {
        if (iVar3 == 1) {
          cVar1 = char_to_hex(bVar2);
          if (cVar1 < '\0') {
            return -1;
          }
          bVar4 = cVar1 << 4;
          iVar3 = 2;
          goto LAB_0010ecae;
        }
        bVar2 = char_to_hex(bVar2);
        if ((char)bVar2 < '\0') {
          return -1;
        }
        *string = bVar2 | bVar4;
        goto LAB_0010ed0b;
      }
      if (bVar2 != 0x25) break;
      iVar3 = 1;
      pbVar5 = (byte *)escaped;
    }
    if (bVar2 == 0x2b) {
      *string = 0x20;
    }
    else {
      *string = bVar2;
    }
LAB_0010ed0b:
    string = (char *)((byte *)string + 1);
    len = len + -1;
    iVar3 = 0;
  } while( true );
}

Assistant:

int
lws_urldecode(char *string, const char *escaped, int len)
{
	int state = 0, n;
	char sum = 0;

	while (*escaped && len) {
		switch (state) {
		case 0:
			if (*escaped == '%') {
				state++;
				escaped++;
				continue;
			}
			if (*escaped == '+') {
				escaped++;
				*string++ = ' ';
				len--;
				continue;
			}
			*string++ = *escaped++;
			len--;
			break;
		case 1:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			sum = n << 4;
			state++;
			break;

		case 2:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			*string++ = sum | n;
			len--;
			state = 0;
			break;
		}

	}
	*string = '\0';

	return 0;
}